

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferErrors.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferErrors::initTest(TextureBufferErrors *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  value_type_conflict4 local_44 [7];
  long local_28;
  Functions *gl;
  TextureBufferErrors *local_10;
  TextureBufferErrors *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
               ,0x59);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_28 + 0x6f8))(1,&this->m_tex_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Could not generate texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                  ,0x60);
  (**(code **)(local_28 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tex_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Could not bind texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                  ,99);
  (**(code **)(local_28 + 0x6c8))(1,&this->m_bo_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Could not generate buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                  ,0x66);
  (**(code **)(local_28 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_bo_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                  ,0x69);
  (**(code **)(local_28 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x1000,0,0x88e5);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Could not allocate buffer object\'s data store",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                  ,0x6c);
  local_44[6] = 0xde1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_44 + 6);
  local_44[5] = 0x8c1a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_44 + 5);
  local_44[4] = 0x806f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_44 + 4);
  local_44[3] = 0x8513;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_44 + 3);
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported & 1U) != 0) {
    local_44[2] = 0x9009;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_texture_targets,local_44 + 2);
  }
  if (((this->super_TestCaseBase).m_is_texture_storage_multisample_supported & 1U) != 0) {
    local_44[1] = 0x9100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_texture_targets,local_44 + 1);
  }
  if (((this->super_TestCaseBase).m_is_texture_storage_multisample_2d_array_supported & 1U) != 0) {
    local_44[0] = 0x9102;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_texture_targets,local_44);
  }
  return;
}

Assistant:

void TextureBufferErrors::initTest(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_bo_size, DE_NULL, GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not allocate buffer object's data store");

	m_texture_targets.push_back(GL_TEXTURE_2D);
	m_texture_targets.push_back(GL_TEXTURE_2D_ARRAY);
	m_texture_targets.push_back(GL_TEXTURE_3D);
	m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP);

	if (m_is_texture_cube_map_array_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	}

	if (m_is_texture_storage_multisample_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	}

	if (m_is_texture_storage_multisample_2d_array_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES);
	}
}